

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

int xmlParseElementStart(xmlParserCtxtPtr ctxt)

{
  xmlChar xVar1;
  xmlParserInputPtr pxVar2;
  _xmlNode *p_Var3;
  xmlDocPtr doc;
  xmlChar *pxVar4;
  _xmlSAXHandler *p_Var5;
  uint uVar6;
  xmlChar *value;
  int iVar7;
  int iVar8;
  int iVar9;
  xmlChar *URI;
  xmlChar *prefix;
  int local_5c;
  xmlParserNodeInfo node_info;
  
  prefix = (xmlChar *)0x0;
  URI = (xmlChar *)0x0;
  iVar9 = ctxt->nsNr;
  if ((xmlParserMaxDepth < (uint)ctxt->nameNr) && ((ctxt->options & 0x80000) == 0)) {
    xmlFatalErrMsgInt(ctxt,XML_ERR_INTERNAL_ERROR,
                      "Excessive depth in document: %d use XML_PARSE_HUGE option\n",
                      xmlParserMaxDepth);
    xmlHaltParser(ctxt);
    return -1;
  }
  if (ctxt->record_info != 0) {
    pxVar2 = ctxt->input;
    node_info.begin_pos = (unsigned_long)(pxVar2->cur + (pxVar2->consumed - (long)pxVar2->base));
    node_info.begin_line = (unsigned_long)pxVar2->line;
  }
  if (ctxt->spaceNr == 0) {
    iVar8 = -1;
  }
  else {
    iVar8 = -1;
    if (*ctxt->space != -2) {
      iVar8 = *ctxt->space;
    }
  }
  spacePush(ctxt,iVar8);
  iVar8 = ctxt->input->line;
  if (ctxt->sax2 == 0) {
    value = xmlParseStartTag(ctxt);
  }
  else {
    value = xmlParseStartTag2(ctxt,&prefix,&URI,&local_5c);
  }
  iVar7 = -1;
  if (ctxt->instate == XML_PARSER_EOF) {
    return -1;
  }
  if (value == (xmlChar *)0x0) {
    spacePop(ctxt);
    return -1;
  }
  if (ctxt->sax2 == 0) {
    namePush(ctxt,value);
  }
  else {
    nameNsPush(ctxt,value,prefix,URI,ctxt->nsNr - iVar9);
  }
  p_Var3 = ctxt->node;
  if ((((ctxt->validate != 0) && (ctxt->wellFormed != 0)) &&
      (doc = ctxt->myDoc, p_Var3 != (_xmlNode *)0x0 && doc != (xmlDocPtr)0x0)) &&
     (p_Var3 == doc->children)) {
    uVar6 = xmlValidateRoot(&ctxt->vctxt,doc);
    ctxt->valid = ctxt->valid & uVar6;
  }
  pxVar2 = ctxt->input;
  pxVar4 = pxVar2->cur;
  xVar1 = *pxVar4;
  if (ctxt->mlType == XML_TYPE_SML) {
    if (xVar1 != '\n') {
      if (xVar1 == ';') {
        pxVar2->cur = pxVar4 + 1;
        pxVar2->col = pxVar2->col + 1;
        xVar1 = pxVar4[1];
joined_r0x00163cdb:
        if (xVar1 == '\0') {
          xmlParserInputGrow(pxVar2,0xfa);
        }
      }
      else {
        if (xVar1 == '{') goto LAB_00163c3f;
        if (xVar1 != '}') goto LAB_00163c6f;
      }
    }
    p_Var5 = ctxt->sax;
    if (ctxt->sax2 == 0) {
      if (((p_Var5 != (_xmlSAXHandler *)0x0) && (p_Var5->endElement != (endElementSAXFunc)0x0)) &&
         (ctxt->disableSAX == 0)) {
        (*p_Var5->endElement)(ctxt->userData,value);
      }
    }
    else if (((p_Var5 != (_xmlSAXHandler *)0x0) &&
             (p_Var5->endElementNs != (endElementNsSAX2Func)0x0)) && (ctxt->disableSAX == 0)) {
      (*p_Var5->endElementNs)(ctxt->userData,value,prefix,URI);
    }
    namePop(ctxt);
    spacePop(ctxt);
    iVar9 = ctxt->nsNr - iVar9;
    if (iVar9 != 0) {
      nsPop(ctxt,iVar9);
    }
    iVar7 = 1;
LAB_00163d68:
    if ((p_Var3 != (_xmlNode *)0x0) && (ctxt->record_info != 0)) {
      pxVar2 = ctxt->input;
      node_info.end_pos = (unsigned_long)(pxVar2->cur + (pxVar2->consumed - (long)pxVar2->base));
      node_info.end_line = (unsigned_long)pxVar2->line;
      node_info.node = p_Var3;
      xmlParserAddNodeInfo(ctxt,&node_info);
    }
  }
  else {
    if (ctxt->mlType == XML_TYPE_XML) {
      if (xVar1 != '>') {
        if ((xVar1 == '/') && (pxVar4[1] == '>')) {
          pxVar2->cur = pxVar4 + 2;
          pxVar2->col = pxVar2->col + 2;
          xVar1 = pxVar4[2];
          goto joined_r0x00163cdb;
        }
        xmlFatalErrMsgStrIntStr
                  (ctxt,XML_ERR_GT_REQUIRED,"Couldn\'t find end of Start Tag %s line %d\n",value,
                   iVar8,(xmlChar *)0x0);
        nodePop(ctxt);
        namePop(ctxt);
        spacePop(ctxt);
        iVar9 = ctxt->nsNr - iVar9;
        if (iVar9 != 0) {
          nsPop(ctxt,iVar9);
        }
        goto LAB_00163d68;
      }
    }
    else {
      if (xVar1 != '{') {
LAB_00163c6f:
        ctxt->curly = 0;
        return 0;
      }
LAB_00163c3f:
      ctxt->curly = 1;
    }
    pxVar2->col = pxVar2->col + 1;
    pxVar2->cur = pxVar4 + 1;
    iVar7 = 0;
    if (pxVar4[1] == '\0') {
      xmlParserInputGrow(pxVar2,0xfa);
    }
  }
  return iVar7;
}

Assistant:

static int
xmlParseElementStart(xmlParserCtxtPtr ctxt) {
    const xmlChar *name;
    const xmlChar *prefix = NULL;
    const xmlChar *URI = NULL;
    xmlParserNodeInfo node_info;
    int line, tlen = 0;
    xmlNodePtr ret;
    int nsNr = ctxt->nsNr;

    DEBUG_ENTER(("xmlParseElementStart(%s);\n", dbgCtxt(ctxt)));

    if (((unsigned int) ctxt->nameNr > xmlParserMaxDepth) &&
        ((ctxt->options & XML_PARSE_HUGE) == 0)) {
	xmlFatalErrMsgInt(ctxt, XML_ERR_INTERNAL_ERROR,
		 "Excessive depth in document: %d use XML_PARSE_HUGE option\n",
			  xmlParserMaxDepth);
	xmlHaltParser(ctxt);
	RETURN_INT(-1);
    }

    /* Capture start position */
    if (ctxt->record_info) {
        node_info.begin_pos = ctxt->input->consumed +
                          (CUR_PTR - ctxt->input->base);
	node_info.begin_line = ctxt->input->line;
    }

    /* TODO FOR SML: Move ctxt->curly to one of these spaces, to avoid having to save it manually? */
    if (ctxt->spaceNr == 0)
	spacePush(ctxt, -1);
    else if (*ctxt->space == -2)
	spacePush(ctxt, -1);
    else
	spacePush(ctxt, *ctxt->space);

    line = ctxt->input->line;
#ifdef LIBXML_SAX1_ENABLED
    if (ctxt->sax2)
#endif /* LIBXML_SAX1_ENABLED */
        name = xmlParseStartTag2(ctxt, &prefix, &URI, &tlen);
#ifdef LIBXML_SAX1_ENABLED
    else
	name = xmlParseStartTag(ctxt);
#endif /* LIBXML_SAX1_ENABLED */
    if (ctxt->instate == XML_PARSER_EOF)
	RETURN_INT(-1);
    if (name == NULL) {
	spacePop(ctxt);
        RETURN_INT(-1);
    }
    if (ctxt->sax2)
        nameNsPush(ctxt, name, prefix, URI, ctxt->nsNr - nsNr);
#ifdef LIBXML_SAX1_ENABLED
    else
        namePush(ctxt, name);
#endif /* LIBXML_SAX1_ENABLED */
    ret = ctxt->node;

#ifdef LIBXML_VALID_ENABLED
    /*
     * [ VC: Root Element Type ]
     * The Name in the document type declaration must match the element
     * type of the root element.
     */
    if (ctxt->validate && ctxt->wellFormed && ctxt->myDoc &&
        ctxt->node && (ctxt->node == ctxt->myDoc->children))
        ctxt->valid &= xmlValidateRoot(&ctxt->vctxt, ctxt->myDoc);
#endif /* LIBXML_VALID_ENABLED */

    /*
     * Check for an Empty Element.
     */
    if (   (ISXML && (RAW == '/') && (NXT(1) == '>'))
    	|| (ISSML && ((RAW == '\n') || (RAW == ';') || (RAW == '}')))) {
        if (ISXML) {						/* XML */
            SKIP(2);
        } else {						/* SML */
            if (RAW == ';') { /* But do not skip '}', which can't belong to an empty element */
		SKIP(1);
            }
        }
	if (ctxt->sax2) {
	    if ((ctxt->sax != NULL) && (ctxt->sax->endElementNs != NULL) &&
		(!ctxt->disableSAX))
		ctxt->sax->endElementNs(ctxt->userData, name, prefix, URI);
#ifdef LIBXML_SAX1_ENABLED
	} else {
	    if ((ctxt->sax != NULL) && (ctxt->sax->endElement != NULL) &&
		(!ctxt->disableSAX))
		ctxt->sax->endElement(ctxt->userData, name);
#endif /* LIBXML_SAX1_ENABLED */
	}
	namePop(ctxt);
	spacePop(ctxt);
	if (nsNr != ctxt->nsNr)
	    nsPop(ctxt, ctxt->nsNr - nsNr);
	if ( ret != NULL && ctxt->record_info ) {
	   node_info.end_pos = ctxt->input->consumed +
			      (CUR_PTR - ctxt->input->base);
	   node_info.end_line = ctxt->input->line;
	   node_info.node = ret;
	   xmlParserAddNodeInfo(ctxt, &node_info);
	}
	RETURN_INT_COMMENT(1, ("xmlParseElement. ctxt = %s;\n", dbgCtxt(ctxt)));
    }
    if (ISXML) {						/* XML */
	if (RAW == '>') {
	    NEXT1;
	} else {
	    xmlFatalErrMsgStrIntStr(ctxt, XML_ERR_GT_REQUIRED,
			 "Couldn't find end of Start Tag %s line %d\n",
				    name, line, NULL);

	    /*
	     * end of parsing of this node.
	     */
	    nodePop(ctxt);
	    namePop(ctxt);
	    spacePop(ctxt);
	    if (nsNr != ctxt->nsNr)
		nsPop(ctxt, ctxt->nsNr - nsNr);

	    /*
	     * Capture end position and add node
	     */
	    if ( ret != NULL && ctxt->record_info ) {
	       node_info.end_pos = ctxt->input->consumed +
				  (CUR_PTR - ctxt->input->base);
	       node_info.end_line = ctxt->input->line;
	       node_info.node = ret;
	       xmlParserAddNodeInfo(ctxt, &node_info);
	    }
	RETURN_INT_COMMENT(-1, ("xmlParseElement. ctxt = %s;\n", dbgCtxt(ctxt)));
	}
    } else {							/* SML */
	if (RAW == '{') {
	    ctxt->curly = 1;
	    NEXT1;
	} else {
	    ctxt->curly = 0;
	}
	DEBUG_PRINTF(("curly = %d;\n", ctxt->curly));
    	/* TODO FOR SML: Is there any test to do here to detect and report invalid tag definitions? */
    }

    RETURN_INT(0);
}